

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  ostream *poVar2;
  int i;
  long lVar3;
  int i_2;
  int iVar4;
  double dVar5;
  allocator<char> local_459;
  Mat x0_lat;
  Mat x0_long;
  Mat ail_input;
  Mat elev_input;
  Mat local_408;
  Mat local_3f8;
  Mat ctrl_input_lat;
  Mat ctrl_input_long;
  string filename;
  RK4 Lat_Dyn_Integrate;
  RK4 Long_Dyn_Integrate;
  ofstream outputs_file;
  
  _outputs_file = 0;
  Mat::Mat(&x0_long,4,(double *)&outputs_file);
  _outputs_file = 0;
  Mat::Mat(&x0_lat,5,(double *)&outputs_file);
  _outputs_file = 0;
  Mat::Mat(&elev_input,100,(double *)&outputs_file);
  lVar3 = 0;
  while( true ) {
    if (t_sim / time_step <= (double)(int)lVar3) break;
    dVar5 = sin(time_step * 3.14159265 * (double)(int)lVar3);
    elev_input.v_[lVar3] = dVar5 * 0.0872664625;
    lVar3 = lVar3 + 1;
  }
  Mat::Transpose(&ctrl_input_long);
  _outputs_file = 0;
  Mat::Mat(&ail_input,100,(double *)&outputs_file);
  lVar3 = 0;
  while( true ) {
    if (t_sim / time_step <= (double)(int)lVar3) break;
    dVar5 = sin(time_step * 3.14159265 * (double)(int)lVar3);
    ail_input.v_[lVar3] = dVar5 * 0.0872664625;
    lVar3 = lVar3 + 1;
  }
  Mat::Transpose(&ctrl_input_lat);
  dVar1 = t_init;
  iVar4 = n_eqs_long;
  dVar5 = t_sim;
  Mat::Mat(&local_3f8,&x0_long);
  RK4::RK4(&Long_Dyn_Integrate,LongDynXdot,iVar4,dVar1,dVar5,&local_3f8,time_step,&ctrl_input_long);
  Mat::~Mat(&local_3f8);
  RK4::Integrate(&Long_Dyn_Integrate);
  poVar2 = std::operator<<((ostream *)&std::cout,"Long dynamics integration finished.");
  std::endl<char,std::char_traits<char>>(poVar2);
  dVar1 = t_init;
  iVar4 = n_eqs_lat;
  dVar5 = t_sim;
  Mat::Mat(&local_408,&x0_lat);
  RK4::RK4(&Lat_Dyn_Integrate,LatDynXdot,iVar4,dVar1,dVar5,&local_408,time_step,&ctrl_input_lat);
  Mat::~Mat(&local_408);
  RK4::Integrate(&Lat_Dyn_Integrate);
  poVar2 = std::operator<<((ostream *)&std::cout,"Lat dynamics integration finished.");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Final long state is: ");
  std::endl<char,std::char_traits<char>>(poVar2);
  Mat::Print(&Long_Dyn_Integrate.y_out_,"Output");
  poVar2 = std::operator<<((ostream *)&std::cout,"Final lat state is: ");
  std::endl<char,std::char_traits<char>>(poVar2);
  Mat::Print(&Lat_Dyn_Integrate.y_out_,"Output");
  std::ofstream::ofstream(&outputs_file);
  std::__cxx11::string::string<std::allocator<char>>((string *)&filename,"sim_out.csv",&local_459);
  std::ofstream::open((string *)&outputs_file,(_Ios_Openmode)&filename);
  poVar2 = std::operator<<((ostream *)&outputs_file,"time");
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = std::operator<<(poVar2,"u_mps");
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = std::operator<<(poVar2,"w_mps");
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = std::operator<<(poVar2,"q_dps");
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = std::operator<<(poVar2,"theta_deg");
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = std::operator<<(poVar2,"v");
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = std::operator<<(poVar2,"p_dps");
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = std::operator<<(poVar2,"r_dps");
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = std::operator<<(poVar2,"phi_deg");
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = std::operator<<(poVar2,"psi_deg");
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar3 = 0;
  while( true ) {
    iVar4 = (int)lVar3;
    if (t_sim / time_step < (double)iVar4) break;
    if (lVar3 == 0) {
      poVar2 = std::ostream::_M_insert<double>(0.0);
      std::operator<<(poVar2,",");
      poVar2 = std::ostream::_M_insert<double>(*x0_long.v_);
      std::operator<<(poVar2,",");
      poVar2 = std::ostream::_M_insert<double>(x0_long.v_[1]);
      std::operator<<(poVar2,",");
      poVar2 = std::ostream::_M_insert<double>(x0_long.v_[2]);
      std::operator<<(poVar2,",");
      poVar2 = std::ostream::_M_insert<double>(x0_long.v_[3]);
      std::operator<<(poVar2,",");
      poVar2 = std::ostream::_M_insert<double>(*x0_lat.v_);
      std::operator<<(poVar2,",");
      poVar2 = std::ostream::_M_insert<double>(x0_lat.v_[1]);
      std::operator<<(poVar2,",");
      poVar2 = std::ostream::_M_insert<double>(x0_lat.v_[2]);
      std::operator<<(poVar2,",");
      poVar2 = std::ostream::_M_insert<double>(x0_lat.v_[3]);
      std::operator<<(poVar2,",");
      dVar5 = x0_lat.v_[4];
    }
    else {
      poVar2 = std::ostream::_M_insert<double>(time_step * (double)iVar4);
      std::operator<<(poVar2,",");
      poVar2 = std::ostream::_M_insert<double>(Long_Dyn_Integrate.Y_Out_.v_[lVar3]);
      std::operator<<(poVar2,",");
      poVar2 = std::ostream::_M_insert<double>
                         (Long_Dyn_Integrate.Y_Out_.v_[Long_Dyn_Integrate.Y_Out_.n_cols_ + iVar4]);
      std::operator<<(poVar2,",");
      poVar2 = std::ostream::_M_insert<double>
                         ((Long_Dyn_Integrate.Y_Out_.v_
                           [iVar4 + Long_Dyn_Integrate.Y_Out_.n_cols_ * 2] * 180.0) / 3.14159265);
      std::operator<<(poVar2,",");
      poVar2 = std::ostream::_M_insert<double>
                         ((Long_Dyn_Integrate.Y_Out_.v_
                           [Long_Dyn_Integrate.Y_Out_.n_cols_ * 3 + iVar4] * 180.0) / 3.14159265);
      std::operator<<(poVar2,",");
      poVar2 = std::ostream::_M_insert<double>(Lat_Dyn_Integrate.Y_Out_.v_[lVar3]);
      std::operator<<(poVar2,",");
      poVar2 = std::ostream::_M_insert<double>
                         ((Lat_Dyn_Integrate.Y_Out_.v_[Lat_Dyn_Integrate.Y_Out_.n_cols_ + iVar4] *
                          180.0) / 3.14159265);
      std::operator<<(poVar2,",");
      poVar2 = std::ostream::_M_insert<double>
                         ((Lat_Dyn_Integrate.Y_Out_.v_[iVar4 + Lat_Dyn_Integrate.Y_Out_.n_cols_ * 2]
                          * 180.0) / 3.14159265);
      std::operator<<(poVar2,",");
      poVar2 = std::ostream::_M_insert<double>
                         ((Lat_Dyn_Integrate.Y_Out_.v_[Lat_Dyn_Integrate.Y_Out_.n_cols_ * 3 + iVar4]
                          * 180.0) / 3.14159265);
      std::operator<<(poVar2,",");
      dVar5 = (Lat_Dyn_Integrate.Y_Out_.v_[iVar4 + Lat_Dyn_Integrate.Y_Out_.n_cols_ * 4] * 180.0) /
              3.14159265;
    }
    poVar2 = std::ostream::_M_insert<double>(dVar5);
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar3 = lVar3 + 1;
  }
  std::ofstream::close();
  std::__cxx11::string::~string((string *)&filename);
  std::ofstream::~ofstream(&outputs_file);
  RK4::~RK4(&Lat_Dyn_Integrate);
  RK4::~RK4(&Long_Dyn_Integrate);
  Mat::~Mat(&ctrl_input_lat);
  Mat::~Mat(&ail_input);
  Mat::~Mat(&ctrl_input_long);
  Mat::~Mat(&elev_input);
  Mat::~Mat(&x0_lat);
  Mat::~Mat(&x0_long);
  return 0;
}

Assistant:

int main()
{   
    // Define initial state
    Mat x0_long(4, 0.0);
    Mat x0_lat(5, 0.0);

    // Define the control inputs
    Mat elev_input(100, 0.0);
    double elev_amplitude = 5 * PI / 180;
    double elev_freq_rps = PI;
    for (int i = 0; i < t_sim/time_step; i++) {
        elev_input(i) = elev_amplitude * sin(elev_freq_rps * time_step * i);
    }
    Mat ctrl_input_long = elev_input.Transpose();

    Mat ail_input(100, 0.0);
    double ail_amplitude = 5 * PI / 180;
    double ail_freq_rps = PI;
    for (int i = 0; i < t_sim/time_step; i++) {
        ail_input(i) = ail_amplitude * sin(ail_freq_rps * time_step * i);
    }
    Mat ctrl_input_lat = ail_input.Transpose();

    // Perform numerical integration
    RK4 Long_Dyn_Integrate(LongDynXdot, n_eqs_long, t_init, t_sim, x0_long, time_step, ctrl_input_long);
    Long_Dyn_Integrate.Integrate();
    std::cout << "Long dynamics integration finished." << std::endl;

    RK4 Lat_Dyn_Integrate(LatDynXdot, n_eqs_lat, t_init, t_sim, x0_lat, time_step, ctrl_input_lat);
    Lat_Dyn_Integrate.Integrate();
    std::cout << "Lat dynamics integration finished." << std::endl;

    // Display results
    std::cout << "Final long state is: " << std::endl;
    Long_Dyn_Integrate.y_out_.Print("Output");

    std::cout << "Final lat state is: " << std::endl;
    Lat_Dyn_Integrate.y_out_.Print("Output");

    // Create a csv file and save output data
    std::ofstream outputs_file;
    std::string filename = "sim_out.csv";
    outputs_file.open(filename);
    outputs_file << "time" << "," << "u_mps" << "," << "w_mps" << "," 
                 << "q_dps" << "," << "theta_deg" << ","
                 << "v" << "," << "p_dps" << "," << "r_dps" << ","
                 << "phi_deg" << "," << "psi_deg" << std::endl;
    for (int i = 0; i <= t_sim/time_step; i++) {
        if (i == 0) {
            outputs_file << 0.0 << "," << x0_long(0) << "," << x0_long(1) << "," 
                         << x0_long(2) << "," << x0_long(3) << ","
                         << x0_lat(0) << "," << x0_lat(1) << "," << x0_lat(2) << ","
                         << x0_lat(3) << "," << x0_lat(4) << std::endl;
        } else {
            outputs_file << time_step * i << "," 
                         << Long_Dyn_Integrate.Y_Out_(0, i) << ","
                         << Long_Dyn_Integrate.Y_Out_(1, i) << ","
                         << Long_Dyn_Integrate.Y_Out_(2, i) * 180.0 / PI << ","
                         << Long_Dyn_Integrate.Y_Out_(3, i) * 180.0 / PI << ","
                         << Lat_Dyn_Integrate.Y_Out_(0, i) << ","
                         << Lat_Dyn_Integrate.Y_Out_(1, i) * 180.0 / PI << ","
                         << Lat_Dyn_Integrate.Y_Out_(2, i) * 180.0 / PI << ","
                         << Lat_Dyn_Integrate.Y_Out_(3, i) * 180.0 / PI << ","
                         << Lat_Dyn_Integrate.Y_Out_(4, i) * 180.0 / PI << std::endl;
        }
        
    }

    // Close the output csv file
    outputs_file.close();
    
    return 0; 
}